

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorod_pentBuilderCmd.cpp
# Opt level: O0

void free_list(generic_list *list,short string_arg)

{
  long *plVar1;
  short in_SI;
  long *in_RDI;
  generic_list *tmp;
  long *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != (long *)0x0) {
    while (local_8 != (long *)0x0) {
      if ((in_SI != 0) && (*local_8 != 0)) {
        free((void *)*local_8);
      }
      if (local_8[1] != 0) {
        free((void *)local_8[1]);
      }
      plVar1 = (long *)local_8[2];
      free(local_8);
      local_8 = plVar1;
    }
  }
  return;
}

Assistant:

static
void free_list(struct generic_list *list, short string_arg)
{
  if (list) {
    struct generic_list *tmp;
    while (list)
      {
        tmp = list;
        if (string_arg && list->arg.string_arg)
          free (list->arg.string_arg);
        if (list->orig)
          free (list->orig);
        list = list->next;
        free (tmp);
      }
  }
}